

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBZR.cxx
# Opt level: O0

void __thiscall
cmCTestBZR::RevnoParser::RevnoParser(RevnoParser *this,cmCTestBZR *bzr,char *prefix,string *rev)

{
  string *rev_local;
  char *prefix_local;
  cmCTestBZR *bzr_local;
  RevnoParser *this_local;
  
  cmProcessTools::LineParser::LineParser(&this->super_LineParser,'\n',true);
  (this->super_LineParser).super_OutputParser._vptr_OutputParser =
       (_func_int **)&PTR__RevnoParser_0166fc28;
  this->Rev = rev;
  cmsys::RegularExpression::RegularExpression(&this->RegexRevno);
  cmProcessTools::LineParser::SetLog
            (&this->super_LineParser,(bzr->super_cmCTestGlobalVC).super_cmCTestVC.Log,prefix);
  cmsys::RegularExpression::compile(&this->RegexRevno,"^([0-9]+)$");
  return;
}

Assistant:

RevnoParser(cmCTestBZR* bzr, const char* prefix, std::string& rev)
    : Rev(rev)
  {
    this->SetLog(&bzr->Log, prefix);
    this->RegexRevno.compile("^([0-9]+)$");
  }